

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Journal.h
# Opt level: O2

void __thiscall
beast::Journal::ScopedStream::ScopedStream<char[32]>
          (ScopedStream *this,Stream *stream,char (*t) [32])

{
  ScopedStream(this,stream->m_sink,stream->m_level);
  std::operator<<((ostream *)&this->m_ostream,*t);
  return;
}

Assistant:

Journal::ScopedStream::ScopedStream (Journal::Stream const& stream, T const& t)
   : ScopedStream (stream.sink(), stream.level())
{
    m_ostream << t;
}